

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_4_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_938;
  float c3s;
  float *output3;
  float *pfStack_928;
  float c2s;
  float *output2;
  float *pfStack_918;
  float c1s;
  float *output1;
  float *pfStack_908;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_528;
  float fStack_524;
  float fStack_520;
  float fStack_51c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  float local_368;
  float fStack_364;
  float fStack_360;
  float fStack_35c;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2c8;
  float fStack_2c4;
  float fStack_2c0;
  float fStack_2bc;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  
  pfStack_908 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_918 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_928 = outputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_938 = outputs[3];
  fVar4 = vertical_coefficients[3];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_328 = (float)*(undefined8 *)input_end_local;
    fStack_324 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_320 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_31c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_a8 = (float)*(undefined8 *)pfStack_908;
    fStack_a4 = (float)((ulong)*(undefined8 *)pfStack_908 >> 0x20);
    fStack_a0 = (float)*(undefined8 *)(pfStack_908 + 2);
    fStack_9c = (float)((ulong)*(undefined8 *)(pfStack_908 + 2) >> 0x20);
    o1[3] = fStack_a4 + fStack_324 * fVar1;
    o1[2] = local_a8 + local_328 * fVar1;
    o0[1] = fStack_9c + fStack_31c * fVar1;
    o0[0] = fStack_a0 + fStack_320 * fVar1;
    local_348 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_344 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_340 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_33c = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_c8 = (float)*(undefined8 *)(pfStack_908 + 4);
    fStack_c4 = (float)((ulong)*(undefined8 *)(pfStack_908 + 4) >> 0x20);
    fStack_c0 = (float)*(undefined8 *)(pfStack_908 + 6);
    fStack_bc = (float)((ulong)*(undefined8 *)(pfStack_908 + 6) >> 0x20);
    o2[3] = fStack_c4 + fStack_344 * fVar1;
    o2[2] = local_c8 + local_348 * fVar1;
    o1[1] = fStack_bc + fStack_33c * fVar1;
    o1[0] = fStack_c0 + fStack_340 * fVar1;
    local_368 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_364 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_360 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_35c = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_e8 = (float)*(undefined8 *)(pfStack_908 + 8);
    fStack_e4 = (float)((ulong)*(undefined8 *)(pfStack_908 + 8) >> 0x20);
    fStack_e0 = (float)*(undefined8 *)(pfStack_908 + 10);
    fStack_dc = (float)((ulong)*(undefined8 *)(pfStack_908 + 10) >> 0x20);
    o3[3] = fStack_e4 + fStack_364 * fVar1;
    o3[2] = local_e8 + local_368 * fVar1;
    o2[1] = fStack_dc + fStack_35c * fVar1;
    o2[0] = fStack_e0 + fStack_360 * fVar1;
    local_388 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_384 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_380 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_37c = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    local_108 = (float)*(undefined8 *)(pfStack_908 + 0xc);
    fStack_104 = (float)((ulong)*(undefined8 *)(pfStack_908 + 0xc) >> 0x20);
    fStack_100 = (float)*(undefined8 *)(pfStack_908 + 0xe);
    fStack_fc = (float)((ulong)*(undefined8 *)(pfStack_908 + 0xe) >> 0x20);
    r0[3] = fStack_104 + fStack_384 * fVar1;
    r0[2] = local_108 + local_388 * fVar1;
    o3[1] = fStack_fc + fStack_37c * fVar1;
    o3[0] = fStack_100 + fStack_380 * fVar1;
    *(undefined8 *)pfStack_908 = o1._8_8_;
    *(undefined8 *)(pfStack_908 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_908 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_908 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_908 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_908 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_908 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_908 + 0xe) = o3._0_8_;
    local_128 = (float)*(undefined8 *)pfStack_918;
    fStack_124 = (float)((ulong)*(undefined8 *)pfStack_918 >> 0x20);
    fStack_120 = (float)*(undefined8 *)(pfStack_918 + 2);
    fStack_11c = (float)((ulong)*(undefined8 *)(pfStack_918 + 2) >> 0x20);
    o1[3] = fStack_124 + fStack_324 * fVar2;
    o1[2] = local_128 + local_328 * fVar2;
    o0[1] = fStack_11c + fStack_31c * fVar2;
    o0[0] = fStack_120 + fStack_320 * fVar2;
    local_148 = (float)*(undefined8 *)(pfStack_918 + 4);
    fStack_144 = (float)((ulong)*(undefined8 *)(pfStack_918 + 4) >> 0x20);
    fStack_140 = (float)*(undefined8 *)(pfStack_918 + 6);
    fStack_13c = (float)((ulong)*(undefined8 *)(pfStack_918 + 6) >> 0x20);
    o2[3] = fStack_144 + fStack_344 * fVar2;
    o2[2] = local_148 + local_348 * fVar2;
    o1[1] = fStack_13c + fStack_33c * fVar2;
    o1[0] = fStack_140 + fStack_340 * fVar2;
    local_168 = (float)*(undefined8 *)(pfStack_918 + 8);
    fStack_164 = (float)((ulong)*(undefined8 *)(pfStack_918 + 8) >> 0x20);
    fStack_160 = (float)*(undefined8 *)(pfStack_918 + 10);
    fStack_15c = (float)((ulong)*(undefined8 *)(pfStack_918 + 10) >> 0x20);
    o3[3] = fStack_164 + fStack_364 * fVar2;
    o3[2] = local_168 + local_368 * fVar2;
    o2[1] = fStack_15c + fStack_35c * fVar2;
    o2[0] = fStack_160 + fStack_360 * fVar2;
    local_188 = (float)*(undefined8 *)(pfStack_918 + 0xc);
    fStack_184 = (float)((ulong)*(undefined8 *)(pfStack_918 + 0xc) >> 0x20);
    fStack_180 = (float)*(undefined8 *)(pfStack_918 + 0xe);
    fStack_17c = (float)((ulong)*(undefined8 *)(pfStack_918 + 0xe) >> 0x20);
    r0[3] = fStack_184 + fStack_384 * fVar2;
    r0[2] = local_188 + local_388 * fVar2;
    o3[1] = fStack_17c + fStack_37c * fVar2;
    o3[0] = fStack_180 + fStack_380 * fVar2;
    *(undefined8 *)pfStack_918 = o1._8_8_;
    *(undefined8 *)(pfStack_918 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_918 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_918 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_918 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_918 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_918 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_918 + 0xe) = o3._0_8_;
    local_1a8 = (float)*(undefined8 *)pfStack_928;
    fStack_1a4 = (float)((ulong)*(undefined8 *)pfStack_928 >> 0x20);
    fStack_1a0 = (float)*(undefined8 *)(pfStack_928 + 2);
    fStack_19c = (float)((ulong)*(undefined8 *)(pfStack_928 + 2) >> 0x20);
    o1[3] = fStack_1a4 + fStack_324 * fVar3;
    o1[2] = local_1a8 + local_328 * fVar3;
    o0[1] = fStack_19c + fStack_31c * fVar3;
    o0[0] = fStack_1a0 + fStack_320 * fVar3;
    local_1c8 = (float)*(undefined8 *)(pfStack_928 + 4);
    fStack_1c4 = (float)((ulong)*(undefined8 *)(pfStack_928 + 4) >> 0x20);
    fStack_1c0 = (float)*(undefined8 *)(pfStack_928 + 6);
    fStack_1bc = (float)((ulong)*(undefined8 *)(pfStack_928 + 6) >> 0x20);
    o2[3] = fStack_1c4 + fStack_344 * fVar3;
    o2[2] = local_1c8 + local_348 * fVar3;
    o1[1] = fStack_1bc + fStack_33c * fVar3;
    o1[0] = fStack_1c0 + fStack_340 * fVar3;
    local_1e8 = (float)*(undefined8 *)(pfStack_928 + 8);
    fStack_1e4 = (float)((ulong)*(undefined8 *)(pfStack_928 + 8) >> 0x20);
    fStack_1e0 = (float)*(undefined8 *)(pfStack_928 + 10);
    fStack_1dc = (float)((ulong)*(undefined8 *)(pfStack_928 + 10) >> 0x20);
    o3[3] = fStack_1e4 + fStack_364 * fVar3;
    o3[2] = local_1e8 + local_368 * fVar3;
    o2[1] = fStack_1dc + fStack_35c * fVar3;
    o2[0] = fStack_1e0 + fStack_360 * fVar3;
    local_208 = (float)*(undefined8 *)(pfStack_928 + 0xc);
    fStack_204 = (float)((ulong)*(undefined8 *)(pfStack_928 + 0xc) >> 0x20);
    fStack_200 = (float)*(undefined8 *)(pfStack_928 + 0xe);
    fStack_1fc = (float)((ulong)*(undefined8 *)(pfStack_928 + 0xe) >> 0x20);
    r0[3] = fStack_204 + fStack_384 * fVar3;
    r0[2] = local_208 + local_388 * fVar3;
    o3[1] = fStack_1fc + fStack_37c * fVar3;
    o3[0] = fStack_200 + fStack_380 * fVar3;
    *(undefined8 *)pfStack_928 = o1._8_8_;
    *(undefined8 *)(pfStack_928 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_928 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_928 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_928 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_928 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_928 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_928 + 0xe) = o3._0_8_;
    local_228 = (float)*(undefined8 *)pfStack_938;
    fStack_224 = (float)((ulong)*(undefined8 *)pfStack_938 >> 0x20);
    fStack_220 = (float)*(undefined8 *)(pfStack_938 + 2);
    fStack_21c = (float)((ulong)*(undefined8 *)(pfStack_938 + 2) >> 0x20);
    o1[3] = fStack_224 + fStack_324 * fVar4;
    o1[2] = local_228 + local_328 * fVar4;
    o0[1] = fStack_21c + fStack_31c * fVar4;
    o0[0] = fStack_220 + fStack_320 * fVar4;
    local_248 = (float)*(undefined8 *)(pfStack_938 + 4);
    fStack_244 = (float)((ulong)*(undefined8 *)(pfStack_938 + 4) >> 0x20);
    fStack_240 = (float)*(undefined8 *)(pfStack_938 + 6);
    fStack_23c = (float)((ulong)*(undefined8 *)(pfStack_938 + 6) >> 0x20);
    o2[3] = fStack_244 + fStack_344 * fVar4;
    o2[2] = local_248 + local_348 * fVar4;
    o1[1] = fStack_23c + fStack_33c * fVar4;
    o1[0] = fStack_240 + fStack_340 * fVar4;
    local_268 = (float)*(undefined8 *)(pfStack_938 + 8);
    fStack_264 = (float)((ulong)*(undefined8 *)(pfStack_938 + 8) >> 0x20);
    fStack_260 = (float)*(undefined8 *)(pfStack_938 + 10);
    fStack_25c = (float)((ulong)*(undefined8 *)(pfStack_938 + 10) >> 0x20);
    o3[3] = fStack_264 + fStack_364 * fVar4;
    o3[2] = local_268 + local_368 * fVar4;
    o2[1] = fStack_25c + fStack_35c * fVar4;
    o2[0] = fStack_260 + fStack_360 * fVar4;
    local_288 = (float)*(undefined8 *)(pfStack_938 + 0xc);
    fStack_284 = (float)((ulong)*(undefined8 *)(pfStack_938 + 0xc) >> 0x20);
    fStack_280 = (float)*(undefined8 *)(pfStack_938 + 0xe);
    fStack_27c = (float)((ulong)*(undefined8 *)(pfStack_938 + 0xe) >> 0x20);
    r0[3] = fStack_284 + fStack_384 * fVar4;
    r0[2] = local_288 + local_388 * fVar4;
    o3[1] = fStack_27c + fStack_37c * fVar4;
    o3[0] = fStack_280 + fStack_380 * fVar4;
    *(undefined8 *)pfStack_938 = o1._8_8_;
    *(undefined8 *)(pfStack_938 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_938 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_938 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_938 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_938 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_938 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_938 + 0xe) = o3._0_8_;
    pfStack_908 = pfStack_908 + 0x10;
    pfStack_918 = pfStack_918 + 0x10;
    pfStack_928 = pfStack_928 + 0x10;
    pfStack_938 = pfStack_938 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_528 = (float)*(undefined8 *)input_end_local;
    fStack_524 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_520 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_51c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_2a8 = (float)*(undefined8 *)pfStack_908;
    fStack_2a4 = (float)((ulong)*(undefined8 *)pfStack_908 >> 0x20);
    fStack_2a0 = (float)*(undefined8 *)(pfStack_908 + 2);
    fStack_29c = (float)((ulong)*(undefined8 *)(pfStack_908 + 2) >> 0x20);
    r0_1[3] = fStack_2a4 + fStack_524 * fVar1;
    r0_1[2] = local_2a8 + local_528 * fVar1;
    o0_1[1] = fStack_29c + fStack_51c * fVar1;
    o0_1[0] = fStack_2a0 + fStack_520 * fVar1;
    *(undefined8 *)pfStack_908 = r0_1._8_8_;
    *(undefined8 *)(pfStack_908 + 2) = o0_1._0_8_;
    local_2c8 = (float)*(undefined8 *)pfStack_918;
    fStack_2c4 = (float)((ulong)*(undefined8 *)pfStack_918 >> 0x20);
    fStack_2c0 = (float)*(undefined8 *)(pfStack_918 + 2);
    fStack_2bc = (float)((ulong)*(undefined8 *)(pfStack_918 + 2) >> 0x20);
    r0_1[3] = fStack_2c4 + fStack_524 * fVar2;
    r0_1[2] = local_2c8 + local_528 * fVar2;
    o0_1[1] = fStack_2bc + fStack_51c * fVar2;
    o0_1[0] = fStack_2c0 + fStack_520 * fVar2;
    *(undefined8 *)pfStack_918 = r0_1._8_8_;
    *(undefined8 *)(pfStack_918 + 2) = o0_1._0_8_;
    local_2e8 = (float)*(undefined8 *)pfStack_928;
    fStack_2e4 = (float)((ulong)*(undefined8 *)pfStack_928 >> 0x20);
    fStack_2e0 = (float)*(undefined8 *)(pfStack_928 + 2);
    fStack_2dc = (float)((ulong)*(undefined8 *)(pfStack_928 + 2) >> 0x20);
    r0_1[3] = fStack_2e4 + fStack_524 * fVar3;
    r0_1[2] = local_2e8 + local_528 * fVar3;
    o0_1[1] = fStack_2dc + fStack_51c * fVar3;
    o0_1[0] = fStack_2e0 + fStack_520 * fVar3;
    *(undefined8 *)pfStack_928 = r0_1._8_8_;
    *(undefined8 *)(pfStack_928 + 2) = o0_1._0_8_;
    local_308 = (float)*(undefined8 *)pfStack_938;
    fStack_304 = (float)((ulong)*(undefined8 *)pfStack_938 >> 0x20);
    fStack_300 = (float)*(undefined8 *)(pfStack_938 + 2);
    fStack_2fc = (float)((ulong)*(undefined8 *)(pfStack_938 + 2) >> 0x20);
    r0_1[3] = fStack_304 + fStack_524 * fVar4;
    r0_1[2] = local_308 + local_528 * fVar4;
    o0_1[1] = fStack_2fc + fStack_51c * fVar4;
    o0_1[0] = fStack_300 + fStack_520 * fVar4;
    *(undefined8 *)pfStack_938 = r0_1._8_8_;
    *(undefined8 *)(pfStack_938 + 2) = o0_1._0_8_;
    pfStack_908 = pfStack_908 + 4;
    pfStack_918 = pfStack_918 + 4;
    pfStack_928 = pfStack_928 + 4;
    pfStack_938 = pfStack_938 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar5 = *input_end_local;
    *pfStack_908 = fVar5 * fVar1 + *pfStack_908;
    *pfStack_918 = fVar5 * fVar2 + *pfStack_918;
    *pfStack_928 = fVar5 * fVar3 + *pfStack_928;
    *pfStack_938 = fVar5 * fVar4 + *pfStack_938;
    pfStack_908 = pfStack_908 + 1;
    pfStack_918 = pfStack_918 + 1;
    pfStack_928 = pfStack_928 + 1;
    pfStack_938 = pfStack_938 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}